

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O2

int cmime_list_map_new(CMimeList_T *list,CMimeList_T **new_list,
                      _func_void_ptr_CMimeListElem_T_ptr_void_ptr *func,void *args)

{
  CMimeList_T *list_00;
  int iVar1;
  void *data;
  
  if (list != (CMimeList_T *)0x0) {
    iVar1 = cmime_list_new(new_list,(_func_void_void_ptr *)0x0);
    if (iVar1 == 0) {
      while (list = (CMimeList_T *)list->head, list != (CMimeList_T *)0x0) {
        list_00 = *new_list;
        data = (*func)((CMimeListElem_T *)list,args);
        cmime_list_append(list_00,data);
      }
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
    }
    return iVar1;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                ,0xf1,
                "int cmime_list_map_new(CMimeList_T *, CMimeList_T **, void *(*)(CMimeListElem_T *, void *), void *)"
               );
}

Assistant:

int cmime_list_map_new(CMimeList_T *list, CMimeList_T **new_list, void *(*func)(CMimeListElem_T *elem,
        void *args), void *args) {
    CMimeListElem_T *elem;
    int ret;
 
    assert(list);

    ret = cmime_list_new(new_list, NULL);
    if(ret != 0) {
        return(-1);
    }
 
    elem = cmime_list_head(list);
    while(elem != NULL) {
        cmime_list_append(*new_list,func(elem,args));
        elem = elem->next;
    }
 
    return(0);
}